

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_6::readPixelData
               (InputStreamMutex *streamData,Data *ifd,int minY,char **buffer,int *dataSize)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  InputExc *pIVar5;
  reference pvVar6;
  value_type vVar7;
  ArgExc *this;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  stringstream _iex_throw_s_2;
  int partNumber;
  int yInFile;
  stringstream _iex_throw_s_1;
  Int64 lineOffset;
  stringstream _iex_throw_s;
  int lineBufferNumber;
  int *in_stack_fffffffffffffa98;
  IStream *in_stack_fffffffffffffaa0;
  stringstream local_4e8 [16];
  ostream local_4d8 [376];
  int local_360;
  int local_35c;
  stringstream local_358 [16];
  ostream local_348 [376];
  value_type local_1d0;
  stringstream local_1b8 [16];
  ostream local_1a8 [380];
  int local_2c;
  int *local_28;
  undefined8 *local_20;
  int local_14;
  long local_10;
  long local_8;
  
  iVar2 = (in_EDX - *(int *)(in_RSI + 0xa4)) / *(int *)(in_RSI + 0x130);
  local_2c = iVar2;
  local_14 = in_EDX;
  if ((iVar2 < 0) ||
     (local_28 = in_R8, local_20 = in_RCX, local_10 = in_RSI, local_8 = in_RDI,
     sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xb0)),
     (int)sVar3 <= iVar2)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar4 = std::operator<<(local_1a8,"Invalid scan line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
    std::operator<<(poVar4," requested or missing.");
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar5,local_1b8);
    __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_10 + 0xb0),
                      (long)local_2c);
  local_1d0 = *pvVar6;
  if (local_1d0 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_358);
    poVar4 = std::operator<<(local_348,"Scan line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
    std::operator<<(poVar4," is missing.");
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar5,local_358);
    __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  bVar1 = isMultiPart(*(int *)(local_10 + 0x60));
  if (bVar1) {
    vVar7 = (**(code **)(**(long **)(local_8 + 0x28) + 0x28))();
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_10 + 0xb0),
                        (long)local_2c);
    if (vVar7 != *pvVar6) {
      (**(code **)(**(long **)(local_8 + 0x28) + 0x30))(*(long **)(local_8 + 0x28),local_1d0);
    }
  }
  else if (*(int *)(local_10 + 0xcc) != local_14) {
    (**(code **)(**(long **)(local_8 + 0x28) + 0x30))(*(long **)(local_8 + 0x28),local_1d0);
  }
  bVar1 = isMultiPart(*(int *)(local_10 + 0x60));
  if ((bVar1) &&
     (Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98),
     local_360 != *(int *)(local_10 + 0x140))) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_4e8);
    poVar4 = std::operator<<(local_4d8,"Unexpected part number ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_360);
    poVar4 = std::operator<<(poVar4,", should be ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(local_10 + 0x140));
    std::operator<<(poVar4,".");
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this,local_4e8);
    __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98)
  ;
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98)
  ;
  if (local_35c != local_14) {
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar5,"Unexpected data block y coordinate.");
    __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  if ((-1 < *local_28) && (*local_28 <= (int)*(undefined8 *)(local_10 + 0x138))) {
    uVar8 = (**(code **)(**(long **)(local_8 + 0x28) + 0x10))();
    if ((uVar8 & 1) == 0) {
      (**(code **)(**(long **)(local_8 + 0x28) + 0x18))
                (*(long **)(local_8 + 0x28),*local_20,*local_28);
    }
    else {
      uVar9 = (**(code **)(**(long **)(local_8 + 0x28) + 0x20))
                        (*(long **)(local_8 + 0x28),*local_28);
      *local_20 = uVar9;
    }
    if (*(int *)(local_10 + 0x98) == 0) {
      *(int *)(local_10 + 0xcc) = local_14 + *(int *)(local_10 + 0x130);
    }
    else {
      *(int *)(local_10 + 0xcc) = local_14 - *(int *)(local_10 + 0x130);
    }
    return;
  }
  pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar5,"Unexpected data block length.");
  __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void
readPixelData (InputStreamMutex *streamData,
               ScanLineInputFile::Data *ifd,
	       int minY,
	       char *&buffer,
	       int &dataSize)
{
    //
    // Read a single line buffer from the input file.
    //
    // If the input file is not memory-mapped, we copy the pixel data into
    // into the array pointed to by buffer.  If the file is memory-mapped,
    // then we change where buffer points to instead of writing into the
    // array (hence buffer needs to be a reference to a char *).
    //

    int lineBufferNumber = (minY - ifd->minY) / ifd->linesInBuffer;
    if (lineBufferNumber < 0 || lineBufferNumber >= int(ifd->lineOffsets.size()))
        THROW (IEX_NAMESPACE::InputExc, "Invalid scan line " << minY << " requested or missing.");

    Int64 lineOffset = ifd->lineOffsets[lineBufferNumber];

    if (lineOffset == 0)
	THROW (IEX_NAMESPACE::InputExc, "Scan line " << minY << " is missing.");

    //
    // Seek to the start of the scan line in the file,
    // if necessary.
    //

    if ( !isMultiPart(ifd->version) )
    {
        if (ifd->nextLineBufferMinY != minY)
            streamData->is->seekg (lineOffset);
    }
    else
    {
        //
        // In a multi-part file, the file pointer may have been moved by
        // other parts, so we have to ask tellg() where we are.
        //
        if (streamData->is->tellg() != ifd->lineOffsets[lineBufferNumber])
            streamData->is->seekg (lineOffset);
    }

    //
    // Read the data block's header.
    //

    int yInFile;

    //
    // Read the part number when we are dealing with a multi-part file.
    //
    if (isMultiPart(ifd->version))
    {
        int partNumber;
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, partNumber);
        if (partNumber != ifd->partNumber)
        {
            THROW (IEX_NAMESPACE::ArgExc, "Unexpected part number " << partNumber
                   << ", should be " << ifd->partNumber << ".");
        }
    }

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, yInFile);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, dataSize);
    
    if (yInFile != minY)
        throw IEX_NAMESPACE::InputExc ("Unexpected data block y coordinate.");

    if (dataSize < 0 || dataSize > static_cast<int>(ifd->lineBufferSize) )
        throw IEX_NAMESPACE::InputExc ("Unexpected data block length.");

    //
    // Read the pixel data.
    //

    if (streamData->is->isMemoryMapped ())
        buffer = streamData->is->readMemoryMapped (dataSize);
    else
        streamData->is->read (buffer, dataSize);

    //
    // Keep track of which scan line is the next one in
    // the file, so that we can avoid redundant seekg()
    // operations (seekg() can be fairly expensive).
    //

    if (ifd->lineOrder == INCREASING_Y)
        ifd->nextLineBufferMinY = minY + ifd->linesInBuffer;
    else
        ifd->nextLineBufferMinY = minY - ifd->linesInBuffer;
}